

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

char * __thiscall cmCPackGenerator::GetOption(cmCPackGenerator *this,string *op)

{
  cmCPackLog *this_00;
  char *pcVar1;
  ostream *poVar2;
  char *msg;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream cmCPackLog_msg;
  char *ret;
  string *op_local;
  cmCPackGenerator *this_local;
  
  pcVar1 = cmMakefile::GetDefinition(this->MakefileMap,op);
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"Warning, GetOption return NULL for: ");
    poVar2 = std::operator<<(poVar2,(string *)op);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = this->Logger;
    std::__cxx11::ostringstream::str();
    msg = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(this_00,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x494,msg);
    std::__cxx11::string::~string(local_1c8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return pcVar1;
}

Assistant:

const char* cmCPackGenerator::GetOption(const std::string& op) const
{
  const char* ret = this->MakefileMap->GetDefinition(op);
  if (!ret) {
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Warning, GetOption return NULL for: " << op << std::endl);
  }
  return ret;
}